

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O2

BlockHash * __thiscall cfd::core::Block::GetBlockHash(BlockHash *__return_storage_ptr__,Block *this)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  SerializeBlockHeader((ByteData *)&local_28,this);
  HashUtil::Sha256D((ByteData256 *)&local_40,(ByteData *)&local_28);
  BlockHash::BlockHash(__return_storage_ptr__,(ByteData256 *)&local_40);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

BlockHash Block::GetBlockHash() const {
  return BlockHash(HashUtil::Sha256D(SerializeBlockHeader()));
}